

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_chacha20(void)

{
  ptls_cipher_suite_t **pppVar1;
  ptls_cipher_suite_t *cs;
  size_t in_stack_00000008;
  
  pppVar1 = ctx->cipher_suites;
  cs = *pppVar1;
  while (cs != (ptls_cipher_suite_t *)0x0) {
    pppVar1 = pppVar1 + 1;
    if (cs->id == 0x1303) goto LAB_00116536;
    cs = *pppVar1;
  }
  cs = (ptls_cipher_suite_t *)0x0;
LAB_00116536:
  test_ctr(cs,"",0x20,"\x01",0x128a80,(void *)0x20,in_stack_00000008);
  return;
}

Assistant:

static void test_chacha20(void)
{
    static const uint8_t key[] = {0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15,
                                  16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31},
                         iv[] = {1, 0, 0, 0, 0, 0, 0, 9, 0, 0, 0, 0x4a, 0, 0, 0, 0},
                         expected[] = {0x10, 0xf1, 0xe7, 0xe4, 0xd1, 0x3b, 0x59, 0x15, 0x50, 0x0f, 0xdd,
                                       0x1f, 0xa3, 0x20, 0x71, 0xc4, 0xc7, 0xd1, 0xf4, 0xc7, 0x33, 0xc0,
                                       0x68, 0x03, 0x04, 0x22, 0xaa, 0x9a, 0xc3, 0xd4, 0x6c, 0x4e};

    test_ctr(find_cipher(ctx, PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256), key, sizeof(key), iv, sizeof(iv), expected,
             sizeof(expected));
}